

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2646:23)>
::getImpl(SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2646:23)>
          *this,ExceptionOrValue *output)

{
  ReadResult actual;
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> depResult;
  undefined1 local_370 [8];
  ExceptionOr<kj::Maybe<kj::OwnFd>_> local_368;
  NullableValue<kj::Exception> local_1c0;
  char local_28;
  size_t local_20;
  
  local_1c0.isSet = false;
  local_28 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_1c0);
  if (local_1c0.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)(local_370 + 8),&local_1c0.field_1.value);
    local_368.value.ptr.isSet = false;
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)output,
               (ExceptionOr<kj::Maybe<kj::OwnFd>_> *)(local_370 + 8));
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::~ExceptionOr
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)(local_370 + 8));
  }
  else if (local_28 == '\x01') {
    actual.capCount = local_20;
    actual.byteCount = (size_t)&this->func;
    anon_class_16_1_6971b95b_for_func::operator()
              ((anon_class_16_1_6971b95b_for_func *)local_370,actual);
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::ExceptionOr
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)(local_370 + 8),(Maybe<kj::OwnFd> *)local_370);
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)output,
               (ExceptionOr<kj::Maybe<kj::OwnFd>_> *)(local_370 + 8));
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::~ExceptionOr
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)(local_370 + 8));
    NullableValue<kj::OwnFd>::~NullableValue((NullableValue<kj::OwnFd> *)local_370);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_1c0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }